

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_a08fa1::HandleGenerateCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *piVar2;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  offset_in_Arguments_to_NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  member;
  uint uVar8;
  char *pcVar9;
  string *inputName;
  ulong uVar10;
  const_iterator __begin2;
  pointer arg;
  const_iterator __end2;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  mode_t local_3b0;
  cmNewLineStyle newLineStyle;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  invalidOptions;
  string local_388;
  string errorMessage;
  _Any_data local_328;
  _Manager_type local_318;
  pointer ppStack_310;
  pointer local_308;
  pointer ppStack_300;
  ios_base local_2f8 [264];
  undefined1 local_1f0 [32];
  string *local_1d0;
  string local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  Arguments arguments;
  offset_in_Arguments_to_vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  member_00;
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x81) {
    errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&errorMessage,"Incorrect arguments to GENERATE subcommand.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)errorMessage._M_dataplus._M_p != &errorMessage.field_2) {
      operator_delete(errorMessage._M_dataplus._M_p,errorMessage.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  if (((anonymous_namespace)::
       HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar6 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar6 != 0)) {
    local_308 = (pointer)0x0;
    ppStack_300 = (pointer)0x0;
    local_318 = (_Manager_type)0x0;
    ppStack_310 = (pointer)0x0;
    local_328._0_8_ = 0;
    local_328._8_8_ = 0;
    errorMessage.field_2._M_allocated_capacity = 0;
    errorMessage.field_2._8_8_ = 0;
    errorMessage._M_dataplus._M_p = (pointer)0x0;
    errorMessage._M_string_length = 0;
    name.super_string_view._M_str = "OUTPUT";
    name.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::optional<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&errorMessage,name,0x30);
    name_00.super_string_view._M_str = "INPUT";
    name_00.super_string_view._M_len = 5;
    cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::optional<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&errorMessage,name_00,0x58);
    name_01.super_string_view._M_str = "CONTENT";
    name_01.super_string_view._M_len = 7;
    cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::optional<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&errorMessage,name_01,0x80);
    name_02.super_string_view._M_str = "CONDITION";
    name_02.super_string_view._M_len = 9;
    cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::optional<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&errorMessage,name_02,0xa8);
    name_03.super_string_view._M_str = "TARGET";
    name_03.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::optional<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&errorMessage,name_03,0xd0);
    name_04.super_string_view._M_str = "NO_SOURCE_PERMISSIONS";
    name_04.super_string_view._M_len = 0x15;
    cmArgumentParser<Arguments>::Bind<bool>
              ((cmArgumentParser<Arguments> *)&errorMessage,name_04,0x120);
    member = 0x121;
    name_05.super_string_view._M_str = "USE_SOURCE_PERMISSIONS";
    name_05.super_string_view._M_len = 0x16;
    cmArgumentParser<Arguments>::Bind<bool>
              ((cmArgumentParser<Arguments> *)&errorMessage,name_05,0x121);
    name_06.super_string_view._M_str = "FILE_PERMISSIONS";
    name_06.super_string_view._M_len = 0x10;
    cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Bind<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&errorMessage,name_06,member);
    name_07.super_string_view._M_str = "NEWLINE_STYLE";
    name_07.super_string_view._M_len = 0xd;
    member_00 = 0xd;
    cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::optional<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&errorMessage,name_07,0xf8);
    cmArgumentParser<Arguments>::BindParsedKeywords
              ((cmArgumentParser<Arguments> *)&errorMessage,member_00);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleGenerateCommand::parser,(ActionMap *)&errorMessage);
    ArgumentParser::Base::~Base((Base *)&errorMessage);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleGenerateCommand::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  errorMessage.field_2._M_allocated_capacity = (size_type)&unparsedArguments;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_1f0._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  arguments.Output.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.Input.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.Content.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.Condition.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.Target.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.NewLineStyle.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.NoSourcePermissions = false;
  arguments.UseSourcePermissions = false;
  arguments.FilePermissions.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.FilePermissions.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.FilePermissions.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arguments.ParsedKeywords.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.ParsedKeywords.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.ParsedKeywords.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  errorMessage._M_dataplus._M_p = (pointer)&HandleGenerateCommand::parser;
  errorMessage._M_string_length = (size_type)&arguments;
  local_328._0_8_ = 0;
  local_328._8_8_ = 0;
  local_318 = (_Manager_type)0x0;
  ppStack_310 = (pointer)0x0;
  local_308 = (pointer)((ulong)local_308 & 0xffffffffffffff00);
  errorMessage.field_2._8_8_ = errorMessage._M_string_length;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&errorMessage,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_1f0,0);
  if (local_318 != (_Manager_type)0x0) {
    (*local_318)(&local_328,&local_328,__destroy_functor);
  }
  bVar4 = ArgumentParser::ParseResult::MaybeReportError
                    (&arguments.super_ParseResult,status->Makefile);
  bVar5 = true;
  if (bVar4) goto LAB_002b9fa9;
  if (unparsedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unparsedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (((arguments.Output.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) &&
        ((arguments.ParsedKeywords.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_len == 6)) &&
       ((short)*(int *)((long)(arguments.ParsedKeywords.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_str + 4) == 0x5455 &&
        *(int *)(arguments.ParsedKeywords.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_str == 0x5054554f)) {
      if ((arguments.Input.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_engaged != false) ||
         (arguments.Content.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged != false)) {
        piVar2 = (int *)arguments.ParsedKeywords.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_str;
        if (arguments.ParsedKeywords.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1]._M_len == 5) {
          if ((char)piVar2[1] != 'T' || *piVar2 != 0x55504e49) goto LAB_002ba038;
          inputName = (string *)&arguments.Input;
          bVar4 = false;
        }
        else {
          if ((arguments.ParsedKeywords.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_len != 7) ||
             (*(int *)((long)piVar2 + 3) != 0x544e4554 || *piVar2 != 0x544e4f43)) {
LAB_002ba038:
            errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&errorMessage,"Unknown argument to GENERATE subcommand.","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_002b9f90;
          }
          bVar4 = true;
          inputName = (string *)&arguments.Content;
        }
        if (arguments.Condition.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          if (arguments.Condition.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length == 0) {
            errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&errorMessage,
                       "CONDITION of sub-command GENERATE must not be empty if specified.","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_002b9f90;
          }
          local_1f0._0_8_ = local_1f0 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1f0,
                     arguments.Condition.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._M_value._M_dataplus._M_p,
                     arguments.Condition.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._M_value._M_string_length +
                     (long)arguments.Condition.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_dataplus._M_p);
        }
        else {
          local_1f0._0_8_ = local_1f0 + 0x10;
          local_1f0._8_8_ = (pointer)0x0;
          local_1f0[0x10] = '\0';
        }
        if (arguments.Target.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          if (arguments.Target.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length != 0) {
            local_1c8._M_dataplus._M_p = (pointer)((long)&local_1c8 + 0x10);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1c8,
                       arguments.Target.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload._M_value._M_dataplus._M_p,
                       arguments.Target.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload._M_value._M_string_length +
                       (long)arguments.Target.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload._M_value._M_dataplus._M_p);
            goto LAB_002ba160;
          }
          errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&errorMessage,
                     "TARGET of sub-command GENERATE must not be empty if specified.","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)errorMessage._M_dataplus._M_p != &errorMessage.field_2) {
            operator_delete(errorMessage._M_dataplus._M_p,
                            errorMessage.field_2._M_allocated_capacity + 1);
          }
          bVar5 = false;
        }
        else {
          local_1c8._M_dataplus._M_p = (pointer)((long)&local_1c8 + 0x10);
          local_1c8._M_string_length = 0;
          local_1c8.field_2._M_local_buf[0] = '\0';
LAB_002ba160:
          cmNewLineStyle::cmNewLineStyle(&newLineStyle);
          if (arguments.NewLineStyle.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged == true) {
            paVar1 = &errorMessage.field_2;
            errorMessage._M_string_length = 0;
            errorMessage.field_2._M_allocated_capacity =
                 errorMessage.field_2._M_allocated_capacity & 0xffffffffffffff00;
            errorMessage._M_dataplus._M_p = (pointer)paVar1;
            bVar5 = cmNewLineStyle::ReadFromArguments(&newLineStyle,args,&errorMessage);
            if (bVar5) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)errorMessage._M_dataplus._M_p != paVar1) {
                operator_delete(errorMessage._M_dataplus._M_p,
                                errorMessage.field_2._M_allocated_capacity + 1);
              }
              goto LAB_002ba1bd;
            }
            cmStrCat<char_const(&)[10],std::__cxx11::string&>
                      (&local_388,(char (*) [10])"GENERATE ",&errorMessage);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388._M_dataplus._M_p != &local_388.field_2) {
              operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)errorMessage._M_dataplus._M_p != paVar1) {
LAB_002ba453:
              operator_delete(errorMessage._M_dataplus._M_p,
                              errorMessage.field_2._M_allocated_capacity + 1);
            }
LAB_002ba460:
            bVar5 = false;
          }
          else {
LAB_002ba1bd:
            pbVar3 = arguments.FilePermissions.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (arguments.NoSourcePermissions == true) {
              if (arguments.UseSourcePermissions == true) {
                errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&errorMessage,
                           "given both NO_SOURCE_PERMISSIONS and USE_SOURCE_PERMISSIONS. Only one option allowed."
                           ,"");
                std::__cxx11::string::_M_assign((string *)&status->Error);
              }
              else {
                if (arguments.FilePermissions.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    arguments.FilePermissions.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002ba394;
                errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&errorMessage,
                           "given both NO_SOURCE_PERMISSIONS and FILE_PERMISSIONS. Only one option allowed."
                           ,"");
                std::__cxx11::string::_M_assign((string *)&status->Error);
              }
LAB_002ba449:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)errorMessage._M_dataplus._M_p != &errorMessage.field_2) goto LAB_002ba453;
              goto LAB_002ba460;
            }
            if (arguments.FilePermissions.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                arguments.FilePermissions.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002ba394:
              if ((bVar4 & arguments.UseSourcePermissions) != 0) {
LAB_002ba417:
                errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&errorMessage,
                           "given USE_SOURCE_PERMISSIONS without a file INPUT.","");
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_002ba449;
              }
              local_3b0 = 0x1a4;
              if (arguments.NoSourcePermissions == false) {
                local_3b0 = 0;
              }
            }
            else {
              if ((arguments._288_2_ & 0x100) != 0) {
                errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&errorMessage,
                           "given both USE_SOURCE_PERMISSIONS and FILE_PERMISSIONS. Only one option allowed."
                           ,"");
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_002ba449;
              }
              if ((arguments.UseSourcePermissions & bVar4) == 1) goto LAB_002ba417;
              local_3b0 = 0;
              invalidOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              invalidOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              invalidOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              arg = arguments.FilePermissions.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
              local_1d0 = inputName;
              do {
                bVar5 = cmFSPermissions::stringToModeT(arg,&local_3b0);
                if (!bVar5) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&invalidOptions,arg);
                }
                arg = arg + 1;
              } while (arg != pbVar3);
              if (invalidOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  invalidOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMessage);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&errorMessage,"given invalid permission ",0x19);
                if (invalidOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    invalidOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  uVar8 = 1;
                  uVar10 = 0;
                  do {
                    pcVar9 = ",\"";
                    if (uVar8 == 1) {
                      pcVar9 = "\"";
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&errorMessage,pcVar9,(ulong)(uVar8 != 1) + 1);
                    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&errorMessage,
                                        invalidOptions.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                        _M_dataplus._M_p,
                                        invalidOptions.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                        _M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
                    uVar10 = (ulong)uVar8;
                    uVar8 = uVar8 + 1;
                  } while (uVar10 < (ulong)((long)invalidOptions.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)invalidOptions.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&errorMessage,".",1);
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::_M_assign((string *)&status->Error);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_388._M_dataplus._M_p != &local_388.field_2) {
                  operator_delete(local_388._M_dataplus._M_p,
                                  local_388.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorMessage);
                std::ios_base::~ios_base(local_2f8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&invalidOptions);
                goto LAB_002ba460;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&invalidOptions);
              inputName = local_1d0;
            }
            cmNewLineStyle::GetCharacters_abi_cxx11_(&errorMessage,&newLineStyle);
            AddEvaluationFile(inputName,&local_1c8,(string *)&arguments.Output,(string *)local_1f0,
                              bVar4,&errorMessage,local_3b0,status);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)errorMessage._M_dataplus._M_p != &errorMessage.field_2) {
              operator_delete(errorMessage._M_dataplus._M_p,
                              errorMessage.field_2._M_allocated_capacity + 1);
            }
            bVar5 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&local_1c8 + 0x10U)) {
            operator_delete(local_1c8._M_dataplus._M_p,
                            CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                     local_1c8.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((pointer)local_1f0._0_8_ != (pointer)(local_1f0 + 0x10)) {
          operator_delete((void *)local_1f0._0_8_,CONCAT71(local_1f0._17_7_,local_1f0[0x10]) + 1);
        }
        goto LAB_002b9fa9;
      }
      errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&errorMessage,"GENERATE requires INPUT or CONTENT option.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&errorMessage,"GENERATE requires OUTPUT as first option.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
  else {
    errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&errorMessage,"Unknown argument to GENERATE subcommand.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
LAB_002b9f90:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)errorMessage._M_dataplus._M_p != &errorMessage.field_2) {
    operator_delete(errorMessage._M_dataplus._M_p,errorMessage.field_2._M_allocated_capacity + 1);
  }
  bVar5 = false;
LAB_002b9fa9:
  HandleGenerateCommand::Arguments::~Arguments(&arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unparsedArguments);
  return bVar5;
}

Assistant:

bool HandleGenerateCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() < 5) {
    status.SetError("Incorrect arguments to GENERATE subcommand.");
    return false;
  }

  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<std::string> Output;
    cm::optional<std::string> Input;
    cm::optional<std::string> Content;
    cm::optional<std::string> Condition;
    cm::optional<std::string> Target;
    cm::optional<std::string> NewLineStyle;
    bool NoSourcePermissions = false;
    bool UseSourcePermissions = false;
    ArgumentParser::NonEmpty<std::vector<std::string>> FilePermissions;
    std::vector<cm::string_view> ParsedKeywords;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("OUTPUT"_s, &Arguments::Output)
      .Bind("INPUT"_s, &Arguments::Input)
      .Bind("CONTENT"_s, &Arguments::Content)
      .Bind("CONDITION"_s, &Arguments::Condition)
      .Bind("TARGET"_s, &Arguments::Target)
      .Bind("NO_SOURCE_PERMISSIONS"_s, &Arguments::NoSourcePermissions)
      .Bind("USE_SOURCE_PERMISSIONS"_s, &Arguments::UseSourcePermissions)
      .Bind("FILE_PERMISSIONS"_s, &Arguments::FilePermissions)
      .Bind("NEWLINE_STYLE"_s, &Arguments::NewLineStyle)
      .BindParsedKeywords(&Arguments::ParsedKeywords);

  std::vector<std::string> unparsedArguments;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(1), &unparsedArguments);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!unparsedArguments.empty()) {
    status.SetError("Unknown argument to GENERATE subcommand.");
    return false;
  }

  if (!arguments.Output || arguments.ParsedKeywords[0] != "OUTPUT"_s) {
    status.SetError("GENERATE requires OUTPUT as first option.");
    return false;
  }
  std::string const& output = *arguments.Output;

  if (!arguments.Input && !arguments.Content) {
    status.SetError("GENERATE requires INPUT or CONTENT option.");
    return false;
  }
  const bool inputIsContent = arguments.ParsedKeywords[1] == "CONTENT"_s;
  if (!inputIsContent && arguments.ParsedKeywords[1] != "INPUT") {
    status.SetError("Unknown argument to GENERATE subcommand.");
    return false;
  }
  std::string const& input =
    inputIsContent ? *arguments.Content : *arguments.Input;

  if (arguments.Condition && arguments.Condition->empty()) {
    status.SetError("CONDITION of sub-command GENERATE must not be empty "
                    "if specified.");
    return false;
  }
  std::string const& condition =
    arguments.Condition ? *arguments.Condition : std::string();

  if (arguments.Target && arguments.Target->empty()) {
    status.SetError("TARGET of sub-command GENERATE must not be empty "
                    "if specified.");
    return false;
  }
  std::string const& target =
    arguments.Target ? *arguments.Target : std::string();

  cmNewLineStyle newLineStyle;
  if (arguments.NewLineStyle) {
    std::string errorMessage;
    if (!newLineStyle.ReadFromArguments(args, errorMessage)) {
      status.SetError(cmStrCat("GENERATE ", errorMessage));
      return false;
    }
  }

  if (arguments.NoSourcePermissions && arguments.UseSourcePermissions) {
    status.SetError("given both NO_SOURCE_PERMISSIONS and "
                    "USE_SOURCE_PERMISSIONS. Only one option allowed.");
    return false;
  }

  if (!arguments.FilePermissions.empty()) {
    if (arguments.NoSourcePermissions) {
      status.SetError("given both NO_SOURCE_PERMISSIONS and "
                      "FILE_PERMISSIONS. Only one option allowed.");
      return false;
    }
    if (arguments.UseSourcePermissions) {
      status.SetError("given both USE_SOURCE_PERMISSIONS and "
                      "FILE_PERMISSIONS. Only one option allowed.");
      return false;
    }
  }

  if (arguments.UseSourcePermissions) {
    if (inputIsContent) {
      status.SetError("given USE_SOURCE_PERMISSIONS without a file INPUT.");
      return false;
    }
  }

  mode_t permissions = 0;
  if (arguments.NoSourcePermissions) {
    permissions |= cmFSPermissions::mode_owner_read;
    permissions |= cmFSPermissions::mode_owner_write;
    permissions |= cmFSPermissions::mode_group_read;
    permissions |= cmFSPermissions::mode_world_read;
  }

  if (!arguments.FilePermissions.empty()) {
    std::vector<std::string> invalidOptions;
    for (auto const& e : arguments.FilePermissions) {
      if (!cmFSPermissions::stringToModeT(e, permissions)) {
        invalidOptions.push_back(e);
      }
    }
    if (!invalidOptions.empty()) {
      std::ostringstream oss;
      oss << "given invalid permission ";
      for (auto i = 0u; i < invalidOptions.size(); i++) {
        if (i == 0u) {
          oss << "\"" << invalidOptions[i] << "\"";
        } else {
          oss << ",\"" << invalidOptions[i] << "\"";
        }
      }
      oss << ".";
      status.SetError(oss.str());
      return false;
    }
  }

  AddEvaluationFile(input, target, output, condition, inputIsContent,
                    newLineStyle.GetCharacters(), permissions, status);
  return true;
}